

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_tagged_sha256
              (secp256k1_context *ctx,uchar *hash32,uchar *tag,size_t taglen,uchar *msg,
              size_t msglen)

{
  void *pvVar1;
  char *pcVar2;
  secp256k1_sha256 sha;
  
  if (hash32 == (uchar *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "hash32 != NULL";
  }
  else if (tag == (uchar *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "tag != NULL";
  }
  else {
    if (msg != (uchar *)0x0) {
      secp256k1_sha256_initialize_tagged(&sha,tag,taglen);
      secp256k1_sha256_write(&sha,msg,msglen);
      secp256k1_sha256_finalize(&sha,hash32);
      return 1;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "msg != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_tagged_sha256(const secp256k1_context* ctx, unsigned char *hash32, const unsigned char *tag, size_t taglen, const unsigned char *msg, size_t msglen) {
    secp256k1_sha256 sha;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(hash32 != NULL);
    ARG_CHECK(tag != NULL);
    ARG_CHECK(msg != NULL);

    secp256k1_sha256_initialize_tagged(&sha, tag, taglen);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, hash32);
    return 1;
}